

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::InnerProductParameter::Clear(InnerProductParameter *this)

{
  uint uVar1;
  LogMessage *pLVar2;
  FillerParameter *pFVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      pFVar3 = this->weight_filler_;
      if (pFVar3 == (FillerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x7365);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_48,"CHECK failed: weight_filler_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_48);
        pFVar3 = this->weight_filler_;
      }
      FillerParameter::Clear(pFVar3);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      pFVar3 = this->bias_filler_;
      if (pFVar3 == (FillerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x7369);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_48,"CHECK failed: bias_filler_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_48);
        pFVar3 = this->bias_filler_;
      }
      FillerParameter::Clear(pFVar3);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
  }
  if ((uVar1 & 0x3c) != 0) {
    this->num_output_ = 0;
    this->transpose_ = false;
    this->bias_term_ = true;
    this->axis_ = 1;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void InnerProductParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.InnerProductParameter)
  if (_has_bits_[0 / 32] & 3u) {
    if (has_weight_filler()) {
      GOOGLE_DCHECK(weight_filler_ != NULL);
      weight_filler_->::caffe::FillerParameter::Clear();
    }
    if (has_bias_filler()) {
      GOOGLE_DCHECK(bias_filler_ != NULL);
      bias_filler_->::caffe::FillerParameter::Clear();
    }
  }
  if (_has_bits_[0 / 32] & 60u) {
    ::memset(&num_output_, 0, reinterpret_cast<char*>(&transpose_) -
      reinterpret_cast<char*>(&num_output_) + sizeof(transpose_));
    bias_term_ = true;
    axis_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}